

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O2

Status __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::ReplaceInterfaceVarsWithScalars
          (InterfaceVariableScalarReplacement *this,Instruction *entry_point)

{
  bool bVar1;
  uint32_t extra_array_length;
  Instruction *array_type;
  DefUseManager *pDVar2;
  pointer ppIVar3;
  Status SVar4;
  _Insert_base<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *this_00;
  Instruction *interface_var;
  uint32_t component;
  uint32_t location;
  _Insert_base<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_60;
  _Insert_base<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_58;
  Instruction *local_50;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> interface_vars
  ;
  
  local_50 = entry_point;
  CollectInterfaceVariables(&interface_vars,this,entry_point);
  local_58 = (_Insert_base<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)&this->vars_without_extra_arrayness;
  local_60 = (_Insert_base<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)&this->vars_with_extra_arrayness;
  SVar4 = SuccessWithoutChange;
  ppIVar3 = interface_vars.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppIVar3 ==
        interface_vars.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_004d0d6f:
      std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ::~_Vector_base(&interface_vars.
                       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     );
      return SVar4;
    }
    interface_var = *ppIVar3;
    bVar1 = GetVariableLocation(this,interface_var,&location);
    if (bVar1) {
      bVar1 = GetVariableComponent(this,interface_var,&component);
      if (!bVar1) {
        component = 0;
      }
      array_type = GetTypeOfVariable(this,interface_var);
      bVar1 = HasExtraArrayness(this,local_50,interface_var);
      extra_array_length = 0;
      this_00 = local_58;
      if (bVar1) {
        pDVar2 = IRContext::get_def_use_mgr((this->super_Pass).context_);
        extra_array_length = anon_unknown_0::GetArrayLength(pDVar2,array_type);
        pDVar2 = IRContext::get_def_use_mgr((this->super_Pass).context_);
        array_type = anon_unknown_0::GetArrayElementType(pDVar2,array_type);
        this_00 = local_60;
      }
      std::__detail::
      _Insert_base<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert(this_00,&interface_var);
      bVar1 = CheckExtraArraynessConflictBetweenEntries(this,interface_var,extra_array_length != 0);
      if (!bVar1) {
LAB_004d0d6d:
        SVar4 = Failure;
        goto LAB_004d0d6f;
      }
      if ((array_type->opcode_ | OpSourceExtension) == OpTypeArray) {
        bVar1 = ReplaceInterfaceVariableWithScalars
                          (this,interface_var,array_type,location,component,extra_array_length);
        SVar4 = SuccessWithChange;
        if (!bVar1) goto LAB_004d0d6d;
      }
    }
    ppIVar3 = ppIVar3 + 1;
  } while( true );
}

Assistant:

Pass::Status
InterfaceVariableScalarReplacement::ReplaceInterfaceVarsWithScalars(
    Instruction& entry_point) {
  std::vector<Instruction*> interface_vars =
      CollectInterfaceVariables(entry_point);

  Pass::Status status = Status::SuccessWithoutChange;
  for (Instruction* interface_var : interface_vars) {
    uint32_t location, component;
    if (!GetVariableLocation(interface_var, &location)) continue;
    if (!GetVariableComponent(interface_var, &component)) component = 0;

    Instruction* interface_var_type = GetTypeOfVariable(interface_var);
    uint32_t extra_array_length = 0;
    if (HasExtraArrayness(entry_point, interface_var)) {
      extra_array_length =
          GetArrayLength(context()->get_def_use_mgr(), interface_var_type);
      interface_var_type =
          GetArrayElementType(context()->get_def_use_mgr(), interface_var_type);
      vars_with_extra_arrayness.insert(interface_var);
    } else {
      vars_without_extra_arrayness.insert(interface_var);
    }

    if (!CheckExtraArraynessConflictBetweenEntries(interface_var,
                                                   extra_array_length != 0)) {
      return Pass::Status::Failure;
    }

    if (interface_var_type->opcode() != spv::Op::OpTypeArray &&
        interface_var_type->opcode() != spv::Op::OpTypeMatrix) {
      continue;
    }

    if (!ReplaceInterfaceVariableWithScalars(interface_var, interface_var_type,
                                             location, component,
                                             extra_array_length)) {
      return Pass::Status::Failure;
    }
    status = Pass::Status::SuccessWithChange;
  }

  return status;
}